

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,int num_digits,string_view prefix,basic_format_specs<char> *spec,num_writer f)

{
  type tVar1;
  alignment aVar2;
  uint uVar3;
  size_t sVar4;
  int in_ESI;
  align_spec *in_R8;
  align_spec as;
  size_t padding;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::num_writer>
  *in_stack_00000070;
  char_type fill;
  size_t size;
  basic_string_view<char> local_10;
  
  sVar4 = basic_string_view<char>::size(&local_10);
  tVar1 = internal::to_unsigned<int>(in_ESI);
  align_spec::fill(in_R8);
  aVar2 = align_spec::align(in_R8);
  if (aVar2 == ALIGN_NUMERIC) {
    uVar3 = align_spec::width(in_R8);
    if (sVar4 + tVar1 < (ulong)uVar3) {
      align_spec::width(in_R8);
      align_spec::width(in_R8);
    }
  }
  else if (in_ESI < (int)in_R8[1].width_) {
    basic_string_view<char>::size(&local_10);
    internal::to_unsigned<int>(in_R8[1].width_);
    internal::to_unsigned<int>(in_R8[1].width_ - in_ESI);
  }
  align_spec::align(in_R8);
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>>
            ((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
              *)spec,(align_spec *)size,in_stack_00000070);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }